

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O3

FT_Pos af_latin_compute_stem_width
                 (AF_GlyphHints hints,AF_Dimension dim,FT_Pos width,FT_Pos base_delta,
                 FT_UInt base_flags,FT_UInt stem_flags)

{
  long lVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  AF_LatinMetrics metrics;
  undefined4 in_register_00000034;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int in_register_00000084;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  byte in_stack_00000008;
  
  uVar8 = CONCAT44(in_register_00000084,base_flags);
  lVar7 = CONCAT44(in_register_00000034,dim);
  if (((ulong)hints & 4) == 0) {
    return base_delta;
  }
  lVar11 = (width & 0xffffffffU) * 0x47c8;
  lVar1 = lVar7 + lVar11;
  if (*(char *)(lVar1 + 0x1f8) != '\0') {
    return base_delta;
  }
  uVar4 = -base_delta;
  if (0 < base_delta) {
    uVar4 = base_delta;
  }
  if ((int)width == 1) {
    if (((ulong)hints & 2) == 0) {
      uVar9 = uVar4;
      if ((in_stack_00000008 >> 1 & uVar4 < 0xc0) != 0) goto LAB_00183a6b;
LAB_0018383a:
      if ((stem_flags & 1) == 0) {
        bVar15 = uVar4 < 0x39;
        uVar9 = 0x38;
      }
      else {
        bVar15 = uVar4 < 0x50;
        uVar9 = 0x40;
      }
      if (!bVar15) {
        uVar9 = uVar4;
      }
      if (*(int *)(lVar1 + 0x60) == 0) goto LAB_00183a6b;
      uVar4 = *(ulong *)(lVar1 + 0x70);
      uVar5 = uVar9 - uVar4;
      uVar6 = -uVar5;
      if (0 < (long)uVar5) {
        uVar6 = uVar5;
      }
      if (uVar6 < 0x28) {
        uVar9 = 0x30;
        if (0x30 < (long)uVar4) {
          uVar9 = uVar4;
        }
        goto LAB_00183a6b;
      }
      if (uVar9 < 0xc0) {
        uVar3 = (uint)uVar9 & 0x3f;
        if (9 < uVar3) {
          uVar8 = (ulong)((uint)uVar9 & 0xc0);
          if (uVar3 < 0x20) {
            uVar9 = uVar8 | 10;
          }
          else if (uVar3 < 0x36) {
            uVar9 = uVar8 | 0x36;
          }
        }
        goto LAB_00183a6b;
      }
      if (((uVar8 == 0 || in_register_00000084 < 0) || base_delta < 1) &&
          -1 < (long)(uVar8 & base_delta)) {
LAB_00183a0b:
        uVar4 = 0;
      }
      else {
        uVar2 = *(ushort *)(*(long *)(*(long *)(lVar7 + 8) + 0xa0) + 0x18);
        if (9 < uVar2) {
          if (0x1d < uVar2) goto LAB_00183a0b;
          uVar8 = (long)((0x1e - uVar2) * uVar8) / 0x14;
        }
        uVar4 = -uVar8;
        if (0 < (long)uVar8) {
          uVar4 = uVar8;
        }
      }
      uVar9 = (uVar9 - uVar4) + 0x20 & 0xffffffffffffffc0;
      goto LAB_00183a6b;
    }
  }
  else if (((ulong)hints & 1) == 0) goto LAB_0018383a;
  uVar8 = uVar4;
  if ((ulong)*(uint *)(lVar1 + 0x60) == 0) {
    uVar9 = uVar4 + 0x20 & 0x7fffffffffffffc0;
LAB_0018390e:
    if ((long)(uVar9 | 0x30) <= (long)uVar4) {
      uVar8 = uVar4;
    }
  }
  else {
    lVar10 = 0x62;
    lVar12 = 0;
    do {
      uVar9 = *(ulong *)(lVar11 + lVar7 + 0x70 + lVar12);
      lVar13 = uVar4 - uVar9;
      lVar14 = -lVar13;
      if (0 < lVar13) {
        lVar14 = lVar13;
      }
      if (lVar14 < lVar10) {
        uVar8 = uVar9;
        lVar10 = lVar14;
      }
      lVar12 = lVar12 + 0x18;
    } while ((ulong)*(uint *)(lVar1 + 0x60) * 0x18 != lVar12);
    uVar9 = uVar8 + 0x20 & 0xffffffffffffffc0;
    if ((long)uVar8 <= (long)uVar4) goto LAB_0018390e;
    if ((long)uVar4 <= (long)(uVar9 - 0x30)) {
      uVar8 = uVar4;
    }
  }
  if ((int)width == 1) {
    uVar9 = 0x40;
    if ((long)uVar8 < 0x40) goto LAB_00183a6b;
    uVar8 = uVar8 + 0x10;
  }
  else {
    if (((ulong)hints & 8) == 0) {
      if ((long)uVar8 < 0x30) {
        uVar9 = (long)(uVar8 + 0x40) >> 1;
        goto LAB_00183a6b;
      }
      if (uVar8 < 0x80) {
        uVar9 = (ulong)((int)uVar8 + 0x16U & 0xc0);
        uVar6 = uVar9 - uVar4;
        uVar8 = -uVar6;
        if (0 < (long)uVar6) {
          uVar8 = uVar6;
        }
        if ((0xf < uVar8) && (uVar9 = uVar4, uVar4 < 0x30)) {
          uVar9 = uVar4 >> 1 | 0x20;
        }
        goto LAB_00183a6b;
      }
    }
    else {
      uVar9 = 0x40;
      if ((long)uVar8 < 0x40) goto LAB_00183a6b;
    }
    uVar8 = uVar8 + 0x20;
  }
  uVar9 = uVar8 & 0x7fffffffffffffc0;
LAB_00183a6b:
  uVar8 = -uVar9;
  if (-1 < base_delta) {
    uVar8 = uVar9;
  }
  return uVar8;
}

Assistant:

static FT_Pos
  af_latin_compute_stem_width( AF_GlyphHints  hints,
                               AF_Dimension   dim,
                               FT_Pos         width,
                               FT_Pos         base_delta,
                               FT_UInt        base_flags,
                               FT_UInt        stem_flags )
  {
    AF_LatinMetrics  metrics  = (AF_LatinMetrics)hints->metrics;
    AF_LatinAxis     axis     = &metrics->axis[dim];
    FT_Pos           dist     = width;
    FT_Int           sign     = 0;
    FT_Int           vertical = ( dim == AF_DIMENSION_VERT );


    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) ||
         axis->extra_light                       )
      return width;

    if ( dist < 0 )
    {
      dist = -width;
      sign = 1;
    }

    if ( (  vertical && !AF_LATIN_HINTS_DO_VERT_SNAP( hints ) ) ||
         ( !vertical && !AF_LATIN_HINTS_DO_HORZ_SNAP( hints ) ) )
    {
      /* smooth hinting process: very lightly quantize the stem width */

      /* leave the widths of serifs alone */
      if ( ( stem_flags & AF_EDGE_SERIF ) &&
           vertical                       &&
           ( dist < 3 * 64 )              )
        goto Done_Width;

      else if ( base_flags & AF_EDGE_ROUND )
      {
        if ( dist < 80 )
          dist = 64;
      }
      else if ( dist < 56 )
        dist = 56;

      if ( axis->width_count > 0 )
      {
        FT_Pos  delta;


        /* compare to standard width */
        delta = dist - axis->widths[0].cur;

        if ( delta < 0 )
          delta = -delta;

        if ( delta < 40 )
        {
          dist = axis->widths[0].cur;
          if ( dist < 48 )
            dist = 48;

          goto Done_Width;
        }

        if ( dist < 3 * 64 )
        {
          delta  = dist & 63;
          dist  &= -64;

          if ( delta < 10 )
            dist += delta;

          else if ( delta < 32 )
            dist += 10;

          else if ( delta < 54 )
            dist += 54;

          else
            dist += delta;
        }
        else
        {
          /* A stem's end position depends on two values: the start        */
          /* position and the stem length.  The former gets usually        */
          /* rounded to the grid, while the latter gets rounded also if it */
          /* exceeds a certain length (see below in this function).  This  */
          /* `double rounding' can lead to a great difference to the       */
          /* original, unhinted position; this normally doesn't matter for */
          /* large PPEM values, but for small sizes it can easily make     */
          /* outlines collide.  For this reason, we adjust the stem length */
          /* by a small amount depending on the PPEM value in case the     */
          /* former and latter rounding both point into the same           */
          /* direction.                                                    */

          FT_Pos  bdelta = 0;


          if ( ( ( width > 0 ) && ( base_delta > 0 ) ) ||
               ( ( width < 0 ) && ( base_delta < 0 ) ) )
          {
            FT_UInt  ppem = metrics->root.scaler.face->size->metrics.x_ppem;


            if ( ppem < 10 )
              bdelta = base_delta;
            else if ( ppem < 30 )
              bdelta = ( base_delta * (FT_Pos)( 30 - ppem ) ) / 20;

            if ( bdelta < 0 )
              bdelta = -bdelta;
          }

          dist = ( dist - bdelta + 32 ) & ~63;
        }
      }
    }
    else
    {
      /* strong hinting process: snap the stem width to integer pixels */

      FT_Pos  org_dist = dist;


      dist = af_latin_snap_width( axis->widths, axis->width_count, dist );

      if ( vertical )
      {
        /* in the case of vertical hinting, always round */
        /* the stem heights to integer pixels            */

        if ( dist >= 64 )
          dist = ( dist + 16 ) & ~63;
        else
          dist = 64;
      }
      else
      {
        if ( AF_LATIN_HINTS_DO_MONO( hints ) )
        {
          /* monochrome horizontal hinting: snap widths to integer pixels */
          /* with a different threshold                                   */

          if ( dist < 64 )
            dist = 64;
          else
            dist = ( dist + 32 ) & ~63;
        }
        else
        {
          /* for horizontal anti-aliased hinting, we adopt a more subtle */
          /* approach: we strengthen small stems, round stems whose size */
          /* is between 1 and 2 pixels to an integer, otherwise nothing  */

          if ( dist < 48 )
            dist = ( dist + 64 ) >> 1;

          else if ( dist < 128 )
          {
            /* We only round to an integer width if the corresponding */
            /* distortion is less than 1/4 pixel.  Otherwise this     */
            /* makes everything worse since the diagonals, which are  */
            /* not hinted, appear a lot bolder or thinner than the    */
            /* vertical stems.                                        */

            FT_Pos  delta;


            dist = ( dist + 22 ) & ~63;
            delta = dist - org_dist;
            if ( delta < 0 )
              delta = -delta;

            if ( delta >= 16 )
            {
              dist = org_dist;
              if ( dist < 48 )
                dist = ( dist + 64 ) >> 1;
            }
          }
          else
            /* round otherwise to prevent color fringes in LCD mode */
            dist = ( dist + 32 ) & ~63;
        }
      }
    }

  Done_Width:
    if ( sign )
      dist = -dist;

    return dist;
  }